

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O1

void hdr_reset_internal_counters(hdr_histogram *h)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  char cVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int64_t iVar11;
  int iVar12;
  
  if ((long)h->counts_len < 1) {
    lVar5 = 0;
    uVar7 = 0xffffffff;
    uVar6 = 0xffffffff;
  }
  else {
    uVar6 = 0xffffffff;
    uVar10 = 0;
    uVar9 = 0xffffffff;
    lVar5 = 0;
    do {
      if (0 < h->counts[uVar10]) {
        lVar5 = lVar5 + h->counts[uVar10];
        uVar7 = uVar6;
        if (uVar6 == 0xffffffff) {
          uVar7 = (uint)uVar10;
        }
        if (uVar10 != 0) {
          uVar6 = uVar7;
        }
        uVar9 = uVar10 & 0xffffffff;
      }
      uVar7 = (uint)uVar9;
      uVar10 = uVar10 + 1;
    } while ((long)h->counts_len != uVar10);
  }
  iVar11 = 0;
  if (uVar7 != 0xffffffff) {
    bVar3 = (byte)h->sub_bucket_half_count_magnitude;
    iVar12 = (int)uVar7 >> (bVar3 & 0x1f);
    iVar1 = h->sub_bucket_half_count;
    iVar8 = iVar12 + -1;
    if (iVar12 < 1) {
      iVar1 = 0;
      iVar8 = 0;
    }
    uVar10 = (long)(int)(iVar1 + (h->sub_bucket_half_count - 1U & uVar7)) <<
             ((char)iVar8 + (char)h->unit_magnitude & 0x3fU);
    uVar9 = h->sub_bucket_mask | uVar10;
    lVar2 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    bVar3 = 0x3f - (((byte)lVar2 ^ 0x3f) + bVar3);
    iVar8 = (int)((long)uVar10 >> (bVar3 & 0x3f));
    iVar11 = ((long)iVar8 << (bVar3 & 0x3f)) +
             (1L << ((h->sub_bucket_count <= iVar8) + bVar3 & 0x3f)) + -1;
  }
  h->max_value = iVar11;
  if (uVar6 == 0xffffffff) {
    lVar2 = 0x7fffffffffffffff;
  }
  else {
    iVar1 = (int)uVar6 >> ((byte)h->sub_bucket_half_count_magnitude & 0x1f);
    cVar4 = (char)iVar1 + -1;
    iVar8 = h->sub_bucket_half_count;
    uVar7 = iVar8 - 1;
    if (iVar1 < 1) {
      cVar4 = '\0';
      iVar8 = 0;
    }
    lVar2 = (long)(int)(iVar8 + (uVar7 & uVar6)) << (cVar4 + (char)h->unit_magnitude & 0x3fU);
  }
  h->min_value = lVar2;
  h->total_count = lVar5;
  return;
}

Assistant:

void hdr_reset_internal_counters(struct hdr_histogram* h)
{
    int min_non_zero_index = -1;
    int max_index = -1;
    int64_t observed_total_count = 0;
    int i;

    for (i = 0; i < h->counts_len; i++)
    {
        int64_t count_at_index;

        if ((count_at_index = counts_get_direct(h, i)) > 0)
        {
            observed_total_count += count_at_index;
            max_index = i;
            if (min_non_zero_index == -1 && i != 0)
            {
                min_non_zero_index = i;
            }
        }
    }

    if (max_index == -1)
    {
        h->max_value = 0;
    }
    else
    {
        int64_t max_value = hdr_value_at_index(h, max_index);
        h->max_value = highest_equivalent_value(h, max_value);
    }

    if (min_non_zero_index == -1)
    {
        h->min_value = INT64_MAX;
    }
    else
    {
        h->min_value = hdr_value_at_index(h, min_non_zero_index);
    }

    h->total_count = observed_total_count;
}